

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O2

Vec_Str_t * Super_WriteLibraryTreeStr(Super_Man_t *pMan)

{
  undefined1 *puVar1;
  uint uVar2;
  Vec_Str_t *vStr;
  char *pcVar3;
  ulong uVar4;
  size_t sVar5;
  long lVar6;
  int iVar7;
  bool bVar8;
  int Counter;
  char pInsert [16];
  
  vStr = (Vec_Str_t *)malloc(0x10);
  vStr->nCap = 1000;
  vStr->nSize = 0;
  pcVar3 = (char *)malloc(1000);
  vStr->pArray = pcVar3;
  Super_WriteFileHeaderStr(pMan,vStr);
  uVar2 = vStr->nSize;
  iVar7 = 9;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    Vec_StrPush(vStr,' ');
  }
  Vec_StrPush(vStr,'\n');
  for (lVar6 = 0;
      (uVar4 = (ulong)pMan->nGates, lVar6 < (long)uVar4 &&
      (pMan->pGates[lVar6] != (Super_Gate_t_conflict *)0x0)); lVar6 = lVar6 + 1) {
    puVar1 = &pMan->pGates[lVar6]->field_0x8;
    *puVar1 = *puVar1 | 2;
  }
  Counter = pMan->nVarsMax;
  for (lVar6 = 0; (lVar6 < (int)uVar4 && (pMan->pGates[lVar6] != (Super_Gate_t_conflict *)0x0));
      lVar6 = lVar6 + 1) {
    Super_WriteLibraryTreeStr_rec(vStr,pMan,pMan->pGates[lVar6],&Counter);
    uVar4 = (ulong)(uint)pMan->nGates;
  }
  lVar6 = 0;
  Vec_StrPush(vStr,'\0');
  sprintf(pInsert,"%d",(ulong)(uint)Counter);
  sVar5 = strlen(pInsert);
  while( true ) {
    if ((int)sVar5 <= lVar6) {
      return vStr;
    }
    iVar7 = uVar2 + (int)lVar6;
    if ((iVar7 < 0) || (vStr->nSize <= iVar7)) break;
    vStr->pArray[lVar6 + (ulong)uVar2] = pInsert[lVar6];
    lVar6 = lVar6 + 1;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
}

Assistant:

Vec_Str_t * Super_WriteLibraryTreeStr( Super_Man_t * pMan )
{
    char pInsert[16];
    Vec_Str_t * vStr;
    Super_Gate_t * pSuper;
    int i, Counter;
    int posStart;
     // write the elementary variables
    vStr = Vec_StrAlloc( 1000 );
    Super_WriteFileHeaderStr( pMan, vStr );
    // write the place holder for the number of lines
    posStart = Vec_StrSize( vStr );
    for ( i = 0; i < 9; i++ )
        Vec_StrPush( vStr, ' ' );
    Vec_StrPush( vStr, '\n' );
    // mark the real supergates
    Super_ManForEachGate( pMan->pGates, pMan->nGates, i, pSuper )
        pSuper->fSuper = 1;
    // write the supergates
    Counter = pMan->nVarsMax;
    Super_ManForEachGate( pMan->pGates, pMan->nGates, i, pSuper )
        Super_WriteLibraryTreeStr_rec( vStr, pMan, pSuper, &Counter );
    Vec_StrPush( vStr, 0 );
    // write the number of lines
    sprintf( pInsert, "%d", Counter );
    for ( i = 0; i < (int)strlen(pInsert); i++ )
        Vec_StrWriteEntry( vStr, posStart + i, pInsert[i] );
    return vStr;
}